

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb3Image.c
# Opt level: O3

Vec_Ptr_t * Llb_NonlinBuildBdds(Aig_Man_t *p,Vec_Ptr_t *vLower,Vec_Ptr_t *vUpper,DdManager *dd)

{
  void *pvVar1;
  int *piVar2;
  DdNode *pDVar3;
  Vec_Ptr_t *__ptr;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  DdNode *f;
  long lVar6;
  int iVar7;
  long lVar8;
  ulong uVar9;
  
  pDVar3 = Cudd_ReadOne(dd);
  (p->pConst1->field_5).pData = pDVar3;
  if (0 < vLower->nSize) {
    lVar8 = 0;
    do {
      pvVar1 = vLower->pArray[lVar8];
      pDVar3 = Cudd_bddIthVar(dd,*(int *)((long)pvVar1 + 0x24));
      *(DdNode **)((long)pvVar1 + 0x28) = pDVar3;
      lVar8 = lVar8 + 1;
    } while (lVar8 < vLower->nSize);
  }
  __ptr = Llb_NonlinCutNodes(p,vLower,vUpper);
  iVar7 = __ptr->nSize;
  if (iVar7 < 1) {
LAB_00830cd1:
    pVVar4 = (Vec_Ptr_t *)malloc(0x10);
    pVVar4->nCap = 100;
    pVVar4->nSize = 0;
    ppvVar5 = (void **)malloc(800);
    pVVar4->pArray = ppvVar5;
    if (0 < vUpper->nSize) {
      uVar9 = 100;
      lVar8 = 0;
      do {
        piVar2 = (int *)vUpper->pArray[lVar8];
        if (((uint)*(undefined8 *)(piVar2 + 6) & 7) - 7 < 0xfffffffe) {
          if ((((uint)*(undefined8 *)(piVar2 + 6) & 7) != 3) || (*piVar2 < p->nTruePos)) {
            __assert_fail("Saig_ObjIsLi(p, pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/bdd/llb/llb3Image.c"
                          ,0x244,
                          "Vec_Ptr_t *Llb_NonlinBuildBdds(Aig_Man_t *, Vec_Ptr_t *, Vec_Ptr_t *, DdManager *)"
                         );
          }
          pDVar3 = (DdNode *)
                   ((ulong)((uint)*(ulong *)(piVar2 + 2) & 1) ^
                   *(ulong *)((*(ulong *)(piVar2 + 2) & 0xfffffffffffffffe) + 0x28));
          f = Cudd_bddIthVar(dd,piVar2[9]);
        }
        else {
          f = Cudd_bddIthVar(dd,piVar2[9]);
          pDVar3 = *(DdNode **)(piVar2 + 10);
        }
        pDVar3 = Cudd_bddXnor(dd,f,pDVar3);
        Cudd_Ref(pDVar3);
        iVar7 = (int)uVar9;
        if ((int)lVar8 == iVar7) {
          if (iVar7 < 0x10) {
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(0x80);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,0x80);
            }
            pVVar4->pArray = ppvVar5;
            pVVar4->nCap = 0x10;
            uVar9 = 0x10;
          }
          else {
            uVar9 = (ulong)(uint)(iVar7 * 2);
            if (pVVar4->pArray == (void **)0x0) {
              ppvVar5 = (void **)malloc(uVar9 * 8);
            }
            else {
              ppvVar5 = (void **)realloc(pVVar4->pArray,uVar9 * 8);
            }
            pVVar4->pArray = ppvVar5;
            pVVar4->nCap = iVar7 * 2;
          }
        }
        else {
          ppvVar5 = pVVar4->pArray;
        }
        lVar6 = lVar8 + 1;
        pVVar4->nSize = (int)lVar6;
        ppvVar5[lVar8] = pDVar3;
        lVar8 = lVar6;
      } while (lVar6 < vUpper->nSize);
      iVar7 = __ptr->nSize;
    }
    if (0 < iVar7) {
      lVar8 = 0;
      do {
        Cudd_RecursiveDeref(dd,*(DdNode **)((long)__ptr->pArray[lVar8] + 0x28));
        lVar8 = lVar8 + 1;
      } while (lVar8 < __ptr->nSize);
    }
    ppvVar5 = __ptr->pArray;
    if (ppvVar5 != (void **)0x0) {
LAB_00830e66:
      free(ppvVar5);
    }
LAB_00830e6b:
    free(__ptr);
    return pVVar4;
  }
  lVar8 = 0;
LAB_00830c79:
  pvVar1 = __ptr->pArray[lVar8];
  pDVar3 = Cudd_bddAnd(dd,(DdNode *)
                          ((ulong)((uint)*(ulong *)((long)pvVar1 + 8) & 1) ^
                          *(ulong *)((*(ulong *)((long)pvVar1 + 8) & 0xfffffffffffffffe) + 0x28)),
                       (DdNode *)
                       ((ulong)((uint)*(ulong *)((long)pvVar1 + 0x10) & 1) ^
                       *(ulong *)((*(ulong *)((long)pvVar1 + 0x10) & 0xfffffffffffffffe) + 0x28)));
  *(DdNode **)((long)pvVar1 + 0x28) = pDVar3;
  if (pDVar3 != (DdNode *)0x0) goto code_r0x00830cbd;
  if (lVar8 != 0) {
    lVar6 = 0;
    do {
      if (__ptr->nSize <= lVar6) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pDVar3 = *(DdNode **)((long)__ptr->pArray[lVar6] + 0x28);
      if (pDVar3 != (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,pDVar3);
      }
      lVar6 = lVar6 + 1;
    } while (lVar8 != lVar6);
  }
  ppvVar5 = __ptr->pArray;
  pVVar4 = (Vec_Ptr_t *)0x0;
  if (ppvVar5 == (void **)0x0) goto LAB_00830e6b;
  goto LAB_00830e66;
code_r0x00830cbd:
  Cudd_Ref(pDVar3);
  lVar8 = lVar8 + 1;
  iVar7 = __ptr->nSize;
  if (iVar7 <= lVar8) goto LAB_00830cd1;
  goto LAB_00830c79;
}

Assistant:

Vec_Ptr_t * Llb_NonlinBuildBdds( Aig_Man_t * p, Vec_Ptr_t * vLower, Vec_Ptr_t * vUpper, DdManager * dd )
{
    Vec_Ptr_t * vNodes, * vResult;
    Aig_Obj_t * pObj;
    DdNode * bBdd0, * bBdd1, * bProd;
    int i, k;

    Aig_ManConst1(p)->pData = Cudd_ReadOne( dd );
    Vec_PtrForEachEntry( Aig_Obj_t *, vLower, pObj, i )
        pObj->pData = Cudd_bddIthVar( dd, Aig_ObjId(pObj) );

    vNodes = Llb_NonlinCutNodes( p, vLower, vUpper );
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
    {
        bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
        bBdd1 = Cudd_NotCond( (DdNode *)Aig_ObjFanin1(pObj)->pData, Aig_ObjFaninC1(pObj) );
//        pObj->pData = Extra_bddAndTime( dd, bBdd0, bBdd1, TimeOut );
        pObj->pData = Cudd_bddAnd( dd, bBdd0, bBdd1 );
        if ( pObj->pData == NULL )
        {
            Vec_PtrForEachEntryStop( Aig_Obj_t *, vNodes, pObj, k, i )
                if ( pObj->pData )
                    Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );
            Vec_PtrFree( vNodes );
            return NULL;
        }
        Cudd_Ref( (DdNode *)pObj->pData );
    }

    vResult = Vec_PtrAlloc( 100 );
    Vec_PtrForEachEntry( Aig_Obj_t *, vUpper, pObj, i )
    {
        if ( Aig_ObjIsNode(pObj) )
        {
            bProd = Cudd_bddXnor( dd, Cudd_bddIthVar(dd, Aig_ObjId(pObj)), (DdNode *)pObj->pData );  Cudd_Ref( bProd );
        }
        else
        {
            assert( Saig_ObjIsLi(p, pObj) );
            bBdd0 = Cudd_NotCond( (DdNode *)Aig_ObjFanin0(pObj)->pData, Aig_ObjFaninC0(pObj) );
            bProd = Cudd_bddXnor( dd, Cudd_bddIthVar(dd, Aig_ObjId(pObj)), bBdd0 );                  Cudd_Ref( bProd );
        }
        Vec_PtrPush( vResult, bProd );
    }
    Vec_PtrForEachEntry( Aig_Obj_t *, vNodes, pObj, i )
        Cudd_RecursiveDeref( dd, (DdNode *)pObj->pData );

    Vec_PtrFree( vNodes );
    return vResult;
}